

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifMap.c
# Opt level: O2

void If_ObjPerformMappingAnd(If_Man_t *p,If_Obj_t *pObj,int Mode,int fPreprocess,int fFirst)

{
  float *pfVar1;
  undefined1 *puVar2;
  float fVar3;
  byte bVar4;
  byte bVar5;
  short sVar6;
  If_Obj_t *pIVar7;
  If_Set_t *pIVar8;
  If_Cut_t *pC0;
  If_Cut_t *pC1;
  If_Cut_t *pC;
  If_DsdMan_t *pIVar9;
  Vec_Str_t *pVVar10;
  _func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *p_Var11;
  _func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *p_Var12;
  _func_int_If_Man_t_ptr_If_Cut_t_ptr *p_Var13;
  If_Cut_t *pIVar14;
  bool bVar15;
  bool bVar16;
  char cVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  If_Man_t *pIVar23;
  abctime aVar24;
  word *pwVar25;
  int *piVar26;
  If_Par_t *pIVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  If_Cut_t *pIVar31;
  long lVar32;
  int iVar33;
  word wVar34;
  uint uVar35;
  int iVar36;
  If_Cut_t *pIVar37;
  If_Cut_t *pIVar38;
  ulong uVar39;
  If_Man_t *pIVar40;
  long lVar41;
  float fVar42;
  uint local_86c;
  long local_858;
  int Cost;
  word local_438 [129];
  
  pIVar27 = p->pPars;
  local_86c = 1;
  uVar28 = 1;
  if ((((((pIVar27->fDelayOpt == 0) && (pIVar27->fDelayOptLut == 0)) &&
        (uVar28 = local_86c, pIVar27->fDsdBalance == 0)) &&
       ((pIVar27->fUserRecLib == 0 && (pIVar27->fUserSesLib == 0)))) && (pIVar27->fUseDsdTune == 0))
     && (((pIVar27->fUseCofVars == 0 && (pIVar27->fUseAndVars == 0)) &&
         ((pIVar27->fUse34Spec == 0 && (pIVar27->pLutStruct == (char *)0x0)))))) {
    uVar28 = (uint)(pIVar27->pFuncCell2 !=
                   (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0);
  }
  local_86c = uVar28;
  bVar15 = true;
  if (pIVar27->nAndDelay < 1) {
    bVar15 = 0 < pIVar27->nAndArea;
  }
  if ((((undefined1  [112])*pObj->pFanin0 & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
     (pObj->pFanin0->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0xac,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if ((((undefined1  [112])*pObj->pFanin1 & (undefined1  [112])0xf) == (undefined1  [112])0x4) &&
     (pObj->pFanin1->pCutSet->nCuts < 1)) {
    __assert_fail("!If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0xad,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  if (Mode == 0) {
    pObj->EstRefs = (float)pObj->nRefs;
    bVar16 = true;
  }
  else {
    if (Mode == 1) {
      iVar18 = pObj->nRefs;
      pObj->EstRefs = (pObj->EstRefs + pObj->EstRefs + (float)iVar18) / 3.0;
    }
    else {
      iVar18 = pObj->nRefs;
    }
    if (0 < iVar18) {
      If_CutAreaDeref(p,&pObj->CutBest);
    }
    bVar16 = false;
  }
  pIVar23 = (If_Man_t *)If_ManSetupNodeCutSet(p,pObj);
  pIVar14 = &pObj->CutBest;
  if (fFirst != 0) goto LAB_0038cdfd;
  pIVar27 = p->pPars;
  if (pIVar27->fDelayOpt == 0) {
    if (pIVar27->fDsdBalance != 0) {
      pIVar40 = p;
      iVar18 = If_CutDsdBalanceEval(p,pIVar14,(Vec_Int_t *)0x0);
      iVar21 = (int)pIVar40;
      goto LAB_0038cce2;
    }
    if (pIVar27->fUserRecLib != 0) {
      pIVar40 = p;
      iVar18 = If_CutDelayRecCost3(p,pIVar14,pObj);
      iVar21 = (int)pIVar40;
      goto LAB_0038cce2;
    }
    if (pIVar27->fUserSesLib == 0) {
      if (pIVar27->fDelayOptLut != 0) {
        pIVar40 = p;
        iVar18 = If_CutLutBalanceEval(p,pIVar14);
        iVar21 = (int)pIVar40;
        goto LAB_0038cce2;
      }
      if (0 < pIVar27->nGateSize) {
        pIVar40 = p;
        iVar18 = If_CutDelaySop(p,pIVar14);
        iVar21 = (int)pIVar40;
        goto LAB_0038cce2;
      }
      pIVar40 = p;
      fVar42 = If_CutDelay(p,pObj,pIVar14);
      iVar21 = (int)pIVar40;
      goto LAB_0038cce6;
    }
    Cost = 0;
    puVar2 = &(pObj->CutBest).field_0x1d;
    *puVar2 = *puVar2 | 0x20;
    pwVar25 = If_CutTruthW(p,pIVar14);
    bVar4 = (pObj->CutBest).field_0x1f;
    piVar26 = If_CutArrTimeProfile(p,pIVar14);
    bVar5 = (pObj->CutBest).field_0x1f;
    iVar18 = If_ManCutAigDelay(p,pObj,pIVar14);
    iVar18 = Abc_ExactDelayCost(pwVar25,(uint)bVar4,piVar26,&pObj[1].field_0x0 + (ulong)bVar5 * 4,
                                &Cost,iVar18);
    iVar21 = (int)pwVar25;
    fVar42 = (float)iVar18;
    (pObj->CutBest).Delay = fVar42;
    if (Cost == 1000000000) {
      uVar28 = *(uint *)&(pObj->CutBest).field_0x1c;
      uVar30 = (ulong)(uVar28 >> 0x18);
      for (uVar39 = 0; uVar30 != uVar39; uVar39 = uVar39 + 1) {
        (&pObj[1].field_0x0)[uVar39 + uVar30 * 4] = 0x78;
      }
      *(uint *)&(pObj->CutBest).field_0x1c = uVar28 | 0x4fff;
    }
  }
  else {
    pIVar40 = p;
    iVar18 = If_CutSopBalanceEval(p,pIVar14,(Vec_Int_t *)0x0);
    iVar21 = (int)pIVar40;
LAB_0038cce2:
    fVar42 = (float)iVar18;
LAB_0038cce6:
    (pObj->CutBest).Delay = fVar42;
  }
  if ((fVar42 == -1.0) && (!NAN(fVar42))) {
    __assert_fail("pCut->Delay != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                  ,0xd9,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
  }
  fVar3 = p->fEpsilon;
  if (fVar3 + fVar3 + pObj->Required < fVar42) {
    Abc_Print(iVar21,
              "If_ObjPerformMappingAnd(): Warning! Node with ID %d has delay (%f) exceeding the required times (%f).\n"
              ,(double)fVar42,(double)(pObj->Required + fVar3),(ulong)(uint)pObj->Id);
  }
  if (Mode == 2) {
    fVar42 = If_CutAreaDerefed(p,pIVar14);
  }
  else {
    fVar42 = If_CutAreaFlow(p,pIVar14);
  }
  pIVar14->Area = fVar42;
  pIVar27 = p->pPars;
  if (pIVar27->fEdge != 0) {
    if (Mode == 2) {
      fVar42 = If_CutEdgeDerefed(p,pIVar14);
    }
    else {
      fVar42 = If_CutEdgeFlow(p,pIVar14);
    }
    (pObj->CutBest).Edge = fVar42;
    pIVar27 = p->pPars;
  }
  if (pIVar27->fPower != 0) {
    if (Mode == 2) {
      fVar42 = If_CutPowerDerefed(p,pIVar14,pObj);
    }
    else {
      fVar42 = If_CutPowerFlow(p,pIVar14,pObj);
    }
    (pObj->CutBest).Power = fVar42;
  }
  if (fPreprocess == 0) {
    pIVar7 = pIVar23->pConst1;
    sVar6 = *(short *)((long)&pIVar23->pName + 2);
    *(short *)((long)&pIVar23->pName + 2) = sVar6 + 1;
    memcpy(*(If_Cut_t **)((long)&pIVar7->field_0x0 + (long)sVar6 * 8),pIVar14,(long)p->nCutBytes);
  }
LAB_0038cdfd:
  lVar32 = 0;
  do {
    pIVar8 = pObj->pFanin0->pCutSet;
    if ((pIVar8->nCuts <= lVar32) || (pC0 = pIVar8->ppCuts[lVar32], pC0 == (If_Cut_t *)0x0)) {
      if (*(short *)((long)&pIVar23->pName + 2) < 1) {
        __assert_fail("pCutSet->nCuts > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                      ,0x1cc,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
      }
      if ((fPreprocess == 0) ||
         ((*(If_Cut_t **)pIVar23->pConst1)->Delay <= pObj->Required + p->fEpsilon)) {
        memcpy(pIVar14,*(If_Cut_t **)pIVar23->pConst1,(long)p->nCutBytes);
        if (((p->pPars->fUserRecLib != 0) || (p->pPars->fUserSesLib != 0)) &&
           (((~*(uint *)&(pObj->CutBest).field_0x1c & 0xfff) == 0 ||
            (pfVar1 = &(pObj->CutBest).Delay, 1e+09 < *pfVar1 || *pfVar1 == 1e+09)))) {
          __assert_fail("If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                        ,0x1d4,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                       );
        }
      }
      pIVar40 = pIVar23;
      if (((pObj->field_0x1 & 0x10) == 0) && (0x1ffffff < *(uint *)&(pObj->CutBest).field_0x1c)) {
        pIVar7 = pIVar23->pConst1;
        sVar6 = *(short *)((long)&pIVar23->pName + 2);
        *(short *)((long)&pIVar23->pName + 2) = sVar6 + 1;
        pIVar40 = p;
        If_ManSetupCutTriv(p,*(If_Cut_t **)((long)&pIVar7->field_0x0 + (long)sVar6 * 8),pObj->Id);
        if (*(short *)&pIVar23->pName + 1 < (int)*(short *)((long)&pIVar23->pName + 2)) {
          __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax+1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                        ,0x1da,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                       );
        }
      }
      iVar18 = (int)pIVar40;
      if ((!bVar16) && (0 < pObj->nRefs)) {
        pIVar23 = p;
        If_CutAreaRef(p,pIVar14);
        iVar18 = (int)pIVar23;
      }
      if (((pObj->CutBest).field_0x1d & 0x40) != 0) {
        Abc_Print(iVar18,"The best cut is useless.\n");
      }
      if (p->pPars->pFuncUser != (_func_int_If_Man_t_ptr_If_Obj_t_ptr_If_Cut_t_ptr *)0x0) {
        for (lVar32 = 0;
            (lVar32 < pObj->pCutSet->nCuts &&
            (pIVar14 = pObj->pCutSet->ppCuts[lVar32], pIVar14 != (If_Cut_t *)0x0));
            lVar32 = lVar32 + 1) {
          (*p->pPars->pFuncUser)(p,pObj,pIVar14);
        }
      }
      If_ManDerefNodeCutSet(p,pObj);
      return;
    }
    for (lVar41 = 0;
        (pIVar8 = pObj->pFanin1->pCutSet, lVar41 < pIVar8->nCuts &&
        (pC1 = pIVar8->ppCuts[lVar41], pC1 != (If_Cut_t *)0x0)); lVar41 = lVar41 + 1) {
      sVar6 = *(short *)((long)&pIVar23->pName + 2);
      if (*(short *)&pIVar23->pName < sVar6) {
        __assert_fail("pCutSet->nCuts <= pCutSet->nCutsMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                      ,0xed,"void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)");
      }
      uVar28 = pC1->uSign | pC0->uSign;
      uVar28 = (uVar28 >> 1 & 0x55555555) + (uVar28 & 0x55555555);
      uVar28 = (uVar28 >> 2 & 0x33333333) + (uVar28 & 0x33333333);
      uVar28 = (uVar28 >> 4 & 0x7070707) + (uVar28 & 0x7070707);
      uVar28 = (uVar28 >> 8 & 0xf000f) + (uVar28 & 0xf000f);
      if ((int)((uVar28 >> 0x10) + (uVar28 & 0xffff)) <= p->pPars->nLutSize) {
        pC = *(If_Cut_t **)((long)&pIVar23->pConst1->field_0x0 + (long)sVar6 * 8);
        uVar28 = *(uint *)pObj >> 4 & 1 ^ *(uint *)&pC0->field_0x1c >> 0xc & 1 ^ pC0->iCutFunc;
        uVar35 = *(uint *)pObj >> 5 & 1 ^ pC1->iCutFunc ^ *(uint *)&pC1->field_0x1c >> 0xc & 1;
        pIVar31 = pC1;
        pIVar37 = pC0;
        uVar20 = uVar35;
        if (p->pPars->fUseTtPerm == 0) {
          iVar18 = If_CutMergeOrdered(p,pC0,pC1,pC);
        }
        else {
          uVar19 = *(uint *)&pC0->field_0x1c >> 0x18;
          uVar29 = *(uint *)&pC1->field_0x1c >> 0x18;
          if ((uVar19 <= uVar29) && ((uVar19 != uVar29 || ((int)uVar28 <= (int)uVar35)))) {
            pIVar31 = pC0;
            pIVar37 = pC1;
            uVar20 = uVar28;
            uVar28 = uVar35;
          }
          iVar18 = If_CutMerge(p,pIVar37,pIVar31,pC);
        }
        if ((iVar18 != 0) &&
           (((pObj->field_0x1 & 4) == 0 || ((uint)(byte)pC->field_0x1f != p->pPars->nLutSize)))) {
          p->nCutsMerged = p->nCutsMerged + 1;
          p->nCutsTotal = p->nCutsTotal + 1;
          if ((p->pPars->fSkipCutFilter != 0) ||
             (iVar18 = If_CutFilter((If_Set_t *)pIVar23,pC,local_86c), iVar18 == 0)) {
            uVar35 = 0;
            if (((bool)((*(uint *)&pC->field_0x1c & 0xff000000) == 0x2000000 & bVar15)) &&
               (pC[1].Area == (float)pObj->pFanin0->Id)) {
              uVar35 = (uint)(pC[1].Edge == (float)pObj->pFanin1->Id) << 0xf;
            }
            pC->iCutFunc = -1;
            *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffff6fff | uVar35;
            pIVar27 = p->pPars;
            if (pIVar27->fTruth == 0) goto LAB_0038d551;
            if (pIVar27->fVerbose == 0) {
              local_858 = 0;
            }
            else {
              local_858 = Abc_Clock();
              pIVar27 = p->pPars;
            }
            pIVar38 = pC;
            if (pIVar27->fUseTtPerm == 0) {
              iVar18 = If_CutComputeTruth(p,pC,pC0,pC1,*(uint *)pObj >> 4 & 1,*(uint *)pObj >> 5 & 1
                                         );
            }
            else {
              iVar18 = If_CutComputeTruthPerm(p,pC,pIVar37,pIVar31,uVar28,uVar20);
            }
            pIVar27 = p->pPars;
            if (pIVar27->fVerbose != 0) {
              aVar24 = Abc_Clock();
              p->timeCache[4] = p->timeCache[4] + (aVar24 - local_858);
              pIVar27 = p->pPars;
            }
            if ((pIVar27->fSkipCutFilter == 0) && (iVar18 != 0)) {
              pIVar38 = pC;
              iVar18 = If_CutFilter((If_Set_t *)pIVar23,pC,local_86c);
              if (iVar18 != 0) goto LAB_0038cebe;
              pIVar27 = p->pPars;
            }
            if ((pIVar27->fLut6Filter != 0) && (pC->field_0x1f == '\x06')) {
              pIVar38 = pC;
              iVar18 = If_CutCheckTruth6(p,pC);
              if (iVar18 == 0) goto LAB_0038cebe;
              pIVar27 = p->pPars;
            }
            if (pIVar27->fUseDsd == 0) {
              uVar28 = *(uint *)&pC->field_0x1c;
            }
            else {
              uVar20 = Abc_Lit2Var(pC->iCutFunc);
              uVar28 = *(uint *)&pC->field_0x1c;
              if ((int)uVar20 < p->vTtDsds[uVar28 >> 0x18]->nSize) {
                pIVar38 = (If_Cut_t *)(ulong)uVar20;
                iVar18 = Vec_IntEntry(p->vTtDsds[uVar28 >> 0x18],uVar20);
                if (iVar18 == -1) {
                  uVar28 = *(uint *)&pC->field_0x1c;
                  goto LAB_0038d1c3;
                }
              }
              else {
LAB_0038d1c3:
                while (p->vTtDsds[uVar28 >> 0x18]->nSize <= (int)uVar20) {
                  Vec_IntPush(p->vTtDsds[uVar28 >> 0x18],(int)pIVar38);
                  uVar35 = 0;
                  while( true ) {
                    uVar28 = *(uint *)&pC->field_0x1c;
                    uVar19 = uVar28 >> 0x18;
                    uVar30 = (ulong)uVar19;
                    if (uVar19 < 7) {
                      uVar19 = 6;
                    }
                    if (uVar19 <= uVar35) break;
                    pIVar38 = (If_Cut_t *)0x78;
                    Vec_StrPush(p->vTtPerms[uVar30],'x');
                    uVar35 = uVar35 + 1;
                  }
                }
                pIVar9 = p->pIfDsdMan;
                pwVar25 = If_CutTruthWR(p,pC);
                bVar4 = pC->field_0x1f;
                pVVar10 = p->vTtPerms[bVar4];
                iVar18 = Abc_Lit2Var(pC->iCutFunc);
                uVar28 = (uint)(byte)pC->field_0x1f;
                if ((byte)pC->field_0x1f < 7) {
                  uVar28 = 6;
                }
                if (pVVar10->nSize <= (int)(uVar28 * iVar18)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                                ,0x175,"char *Vec_StrEntryP(Vec_Str_t *, int)");
                }
                iVar18 = If_DsdManCompute(pIVar9,pwVar25,(uint)bVar4,
                                          (uchar *)(pVVar10->pArray + uVar28 * iVar18),
                                          p->pPars->pLutStruct);
                Vec_IntWriteEntry(p->vTtDsds[(byte)pC->field_0x1f],uVar20,iVar18);
              }
              pIVar9 = p->pIfDsdMan;
              uVar28 = If_CutDsdLit(p,pC);
              pIVar38 = (If_Cut_t *)(ulong)uVar28;
              uVar20 = If_DsdManSuppSize(pIVar9,uVar28);
              uVar28 = *(uint *)&pC->field_0x1c;
              if (uVar20 != uVar28 >> 0x18) {
                __assert_fail("If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                              ,0x138,
                              "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)")
                ;
              }
            }
            *(uint *)&pC->field_0x1c = uVar28 & 0xffffbfff;
            pIVar27 = p->pPars;
            p_Var11 = pIVar27->pFuncCell;
            if ((p_Var11 == (_func_int_If_Man_t_ptr_uint_ptr_int_int_char_ptr *)0x0) &&
               (pIVar27->pFuncCell2 ==
                (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0)) {
              if (pIVar27->fUseDsdTune == 0) {
                if (pIVar27->fUse34Spec != 0) {
                  if (0x4ffffff < uVar28) {
                    __assert_fail("pCut->nLeaves <= 4",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                  ,0x16d,
                                  "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                 );
                  }
                  if ((uVar28 & 0x7000000) == 0x4000000) {
                    pwVar25 = If_CutTruthW(p,pC);
                    uVar28 = (uint)*pwVar25;
                    uVar20 = uVar28 & 0xffff;
                    if (((((uVar20 & uVar20 - 1) != 0) && ((short)uVar28 != 0x6996)) &&
                        (((uVar28 & 0xffff) != 0x9669 &&
                         (((uVar20 ^ 0xffff) & 0xfffe - uVar20) != 0)))) &&
                       (((uVar28 = (uVar28 >> 1 & 0x5555) + (uVar28 & 0x5555),
                         uVar28 = (uVar28 >> 2 & 0x3333) + (uVar28 & 0x3333),
                         uVar28 = (uVar28 >> 4 & 0x707) + (uVar28 & 0x707),
                         iVar18 = (uVar28 >> 8) + (uVar28 & 0xff), uVar28 = uVar20 ^ 0xffff,
                         iVar18 != 9 && (uVar28 = uVar20, iVar18 != 7)) ||
                        (iVar18 = Abc_Tt4CheckTwoLevel(uVar28), iVar18 < 1)))) {
                      pC->field_0x1d = pC->field_0x1d | 0x40;
                    }
                  }
                  goto LAB_0038d551;
                }
                if (pIVar27->fUseAndVars != 0) {
                  uVar28 = Abc_Lit2Var(pC->iCutFunc);
                  if (0xd < p->pPars->nLutSize) {
                    __assert_fail("p->pPars->nLutSize <= 13",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                  ,0x176,
                                  "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                 );
                  }
                  if ((int)uVar28 < p->vTtDecs[(byte)pC->field_0x1f]->nSize) {
                    pIVar38 = (If_Cut_t *)(ulong)uVar28;
                    iVar18 = Vec_IntEntry(p->vTtDecs[(byte)pC->field_0x1f],uVar28);
                    if (iVar18 == -1) goto LAB_0038d902;
                  }
                  else {
LAB_0038d902:
                    while( true ) {
                      uVar30 = (ulong)(byte)pC->field_0x1f;
                      if ((int)uVar28 < p->vTtDecs[uVar30]->nSize) break;
                      Vec_IntPush(p->vTtDecs[uVar30],(int)pIVar38);
                    }
                    iVar18 = p->pPars->nLutSize / 2;
                    uVar35 = (uint)(byte)pC->field_0x1f;
                    uVar20 = 0;
                    if ((iVar18 < (int)uVar35) &&
                       (uVar20 = 0,
                       uVar35 == iVar18 * 2 ||
                       SBORROW4(uVar35,iVar18 * 2) != (int)(uVar35 + iVar18 * -2) < 0)) {
                      pwVar25 = If_CutTruthWR(p,pC);
                      uVar35 = *(uint *)&pC->field_0x1c;
                      iVar21 = p->pPars->nLutSize / 2;
                      iVar18 = 1 << ((char)(uVar35 >> 0x18) - 6U & 0x1f);
                      if (uVar35 < 0x7000000) {
                        iVar18 = 1;
                      }
                      Abc_TtCopy((word *)&Cost,pwVar25,iVar18,0);
                      uVar20 = Abc_TtProcessBiDecInt((word *)&Cost,uVar35 >> 0x18,iVar21);
                      if (uVar20 == 0) {
                        Abc_TtCopy((word *)&Cost,pwVar25,iVar18,1);
                        uVar35 = Abc_TtProcessBiDecInt((word *)&Cost,uVar35 >> 0x18,iVar21);
                        uVar20 = uVar35 | 0x40000000;
                        if (uVar35 == 0) {
                          uVar20 = 0;
                        }
                      }
                      uVar30 = (ulong)(byte)pC->field_0x1f;
                    }
                    Vec_IntWriteEntry(p->vTtDecs[uVar30],uVar28,uVar20);
                  }
                  iVar18 = Vec_IntEntry(p->vTtDecs[(byte)pC->field_0x1f],uVar28);
                  if (iVar18 < 0) {
                    __assert_fail("iDecMask >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                  ,0x182,
                                  "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                                 );
                  }
                  uVar28 = 0;
                  if (iVar18 == 0) {
                    uVar28 = (uint)(p->pPars->nLutSize / 2 < (int)(*(uint *)&pC->field_0x1c >> 0x18)
                                   ) << 0xe;
                  }
                  *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffbfff | uVar28;
                  p->nCutsUselessAll = p->nCutsUselessAll + (uVar28 >> 0xe);
                  p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                       p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                       (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
                  p->nCutsCountAll = p->nCutsCountAll + 1;
                  p->nCutsCount[(byte)pC->field_0x1f] = p->nCutsCount[(byte)pC->field_0x1f] + 1;
                  pIVar27 = p->pPars;
                }
                if ((pIVar27->fUseCofVars == 0) ||
                   ((pIVar27->fUseAndVars != 0 && ((pC->field_0x1d & 0x40) == 0))))
                goto LAB_0038d551;
                uVar28 = Abc_Lit2Var(pC->iCutFunc);
                if ((p->vTtVars[(byte)pC->field_0x1f]->nSize <= (int)uVar28) ||
                   (cVar17 = Vec_StrEntry(p->vTtVars[(byte)pC->field_0x1f],uVar28), cVar17 == -1)) {
                  while (p->vTtVars[(byte)pC->field_0x1f]->nSize <= (int)uVar28) {
                    Vec_StrPush(p->vTtVars[(byte)pC->field_0x1f],-1);
                  }
                  pwVar25 = If_CutTruthWR(p,pC);
                  uVar20 = *(uint *)&pC->field_0x1c;
                  uVar35 = uVar20 >> 0x18;
                  iVar18 = p->pPars->nLutSize / 2;
                  iVar21 = 1 << ((char)(uVar20 >> 0x18) - 6U & 0x1f);
                  if (uVar20 < 0x7000000) {
                    iVar21 = 1;
                  }
                  if (0xdffffff < uVar20) {
                    __assert_fail("nVars <= nVarsMax",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                                  ,0x5eb,"int Abc_TtCheckCondDep(word *, int, int)");
                  }
                  uVar20 = 0;
                  if (iVar18 + 1 < (int)uVar35) {
                    uVar19 = 0;
LAB_0038db63:
                    uVar20 = uVar35;
                    if (uVar19 != uVar35) {
                      Abc_TtCofactor0p((word *)&Cost,pwVar25,iVar21,uVar19);
                      Abc_TtCofactor1p(local_438,pwVar25,iVar21,uVar19);
                      uVar29 = 0;
                      iVar33 = 0;
                      iVar36 = 0;
                      do {
                        uVar20 = uVar19;
                        if (uVar35 == uVar29) break;
                        if (uVar19 != uVar29) {
                          iVar22 = Abc_TtHasVar((word *)&Cost,uVar35,uVar29);
                          iVar33 = iVar22 + iVar33;
                          iVar22 = Abc_TtHasVar(local_438,uVar35,uVar29);
                          if ((iVar18 < iVar33) || (iVar36 = iVar36 + iVar22, iVar18 < iVar36))
                          goto LAB_0038dc07;
                        }
                        uVar29 = uVar29 + 1;
                      } while( true );
                    }
                  }
                  if (p->vTtVars[(byte)pC->field_0x1f]->nSize <= (int)uVar28) {
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                                  ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
                  }
                  p->vTtVars[(byte)pC->field_0x1f]->pArray[uVar28] = (char)uVar20;
                }
                cVar17 = Vec_StrEntry(p->vTtVars[(byte)pC->field_0x1f],uVar28);
                if (cVar17 < '\0') {
LAB_0038e0fc:
                  __assert_fail("iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                                ,0x194,
                                "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)"
                               );
                }
                uVar28 = *(uint *)&pC->field_0x1c;
                if ((int)(uVar28 >> 0x18) < (int)cVar17) goto LAB_0038e0fc;
                uVar20 = (uint)(0xffffff < uVar28 && uVar28 >> 0x18 == (int)cVar17);
                *(uint *)&pC->field_0x1c = uVar28 & 0xffffbfff | uVar20 << 0xe;
                p->nCutsUselessAll = p->nCutsUselessAll + uVar20;
              }
              else {
                pIVar9 = p->pIfDsdMan;
                iVar18 = If_CutDsdLit(p,pC);
                uVar28 = If_DsdManReadMark(pIVar9,iVar18);
                *(uint *)&pC->field_0x1c =
                     *(uint *)&pC->field_0x1c & 0xffffbfff | (uVar28 & 1) << 0xe;
                p->nCutsUselessAll = p->nCutsUselessAll + (uVar28 & 1);
              }
              p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                   p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                   (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
              p->nCutsCountAll = p->nCutsCountAll + 1;
              p->nCutsCount[(byte)pC->field_0x1f] = p->nCutsCount[(byte)pC->field_0x1f] + 1;
            }
            else {
              if (pIVar27->fUseTtPerm != 0) {
                __assert_fail("p->pPars->fUseTtPerm == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                              ,0x13f,
                              "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)")
                ;
              }
              if (0xc < (uVar28 >> 0x10 & 0xff) - 4) {
                __assert_fail("pCut->nLimit >= 4 && pCut->nLimit <= 16",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifMap.c"
                              ,0x140,
                              "void If_ObjPerformMappingAnd(If_Man_t *, If_Obj_t *, int, int, int)")
                ;
              }
              if (pIVar27->fUseDsd == 0) {
                p_Var12 = pIVar27->pFuncCell2;
                if (p_Var12 == (_func_int_If_Man_t_ptr_word_ptr_int_Vec_Str_t_ptr_char_ptr_ptr *)0x0
                   ) {
                  pwVar25 = If_CutTruthW(p,pC);
                  uVar20 = *(uint *)&pC->field_0x1c >> 0x18;
                  uVar28 = 6;
                  if (6 < uVar20) {
                    uVar28 = uVar20;
                  }
                  iVar18 = (*p_Var11)(p,(uint *)pwVar25,uVar28,uVar20,p->pPars->pLutStruct);
                }
                else {
                  pwVar25 = If_CutTruthW(p,pC);
                  iVar18 = (*p_Var12)(p,pwVar25,(uint)(byte)pC->field_0x1f,(Vec_Str_t *)0x0,
                                      (char **)0x0);
                }
                uVar28 = (uint)(iVar18 == 0);
              }
              else {
                pIVar9 = p->pIfDsdMan;
                iVar18 = If_CutDsdLit(p,pC);
                uVar28 = If_DsdManCheckDec(pIVar9,iVar18);
                uVar28 = uVar28 & 1;
              }
              *(uint *)&pC->field_0x1c = *(uint *)&pC->field_0x1c & 0xffffbfff | uVar28 << 0xe;
              p->nCutsUselessAll = p->nCutsUselessAll + uVar28;
              p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] =
                   p->nCutsUseless[*(uint *)&pC->field_0x1c >> 0x18] +
                   (uint)((*(uint *)&pC->field_0x1c >> 0xe & 1) != 0);
              p->nCutsCountAll = p->nCutsCountAll + 1;
              p->nCutsCount[(byte)pC->field_0x1f] = p->nCutsCount[(byte)pC->field_0x1f] + 1;
              pIVar27 = p->pPars;
              if (((pIVar27->fEnableCheck75 == 0) && (pIVar27->fEnableCheck75u == 0)) ||
                 (*(short *)&pC->field_0x1e != 0x505)) {
                if ((pIVar27->fVerbose != 0) && (pC->field_0x1f == '\x05')) {
                  pwVar25 = If_CutTruthW(p,pC);
                  wVar34 = CONCAT44((int)*pwVar25,(int)*pwVar25);
                  p->nCuts5 = p->nCuts5 + 1;
                  iVar18 = If_CluCheckDecInAny(wVar34,5);
                  if ((iVar18 != 0) || (iVar18 = If_CluCheckDecOut(wVar34,5), iVar18 != 0))
                  goto LAB_0038d54a;
                }
              }
              else {
                pwVar25 = If_CutTruthW(p,pC);
                wVar34 = *pwVar25;
                p->nCuts5 = p->nCuts5 + 1;
                iVar18 = If_CluCheckDecInAny(CONCAT44((int)wVar34,(int)wVar34),5);
                if (iVar18 == 0) goto LAB_0038cebe;
LAB_0038d54a:
                p->nCuts5a = p->nCuts5a + 1;
              }
            }
LAB_0038d551:
            uVar28 = *(uint *)&pC->field_0x1c & 0xffffdfff |
                     (uint)(p->pPars->pFuncCost != (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0) <<
                     0xd;
            *(uint *)&pC->field_0x1c = uVar28;
            p_Var13 = p->pPars->pFuncCost;
            if (p_Var13 == (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0) {
              uVar20 = 0;
            }
            else {
              uVar20 = (*p_Var13)(p,pC);
              uVar20 = uVar20 & 0xfff;
              uVar28 = *(uint *)&pC->field_0x1c;
            }
            uVar28 = uVar28 & 0xfffff000 | uVar20;
            *(uint *)&pC->field_0x1c = uVar28;
            if (uVar20 != 0xfff) {
              pIVar27 = p->pPars;
              if (pIVar27->fDelayOpt == 0) {
                if (pIVar27->fDsdBalance != 0) {
                  iVar18 = If_CutDsdBalanceEval(p,pC,(Vec_Int_t *)0x0);
                  goto LAB_0038d60b;
                }
                if (pIVar27->fUserRecLib != 0) {
                  iVar18 = If_CutDelayRecCost3(p,pC,pObj);
                  goto LAB_0038d60b;
                }
                if (pIVar27->fUserSesLib == 0) {
                  if (pIVar27->fDelayOptLut != 0) {
                    iVar18 = If_CutLutBalanceEval(p,pC);
                    goto LAB_0038d60b;
                  }
                  if (pIVar27->nGateSize < 1) {
                    fVar42 = If_CutDelay(p,pObj,pC);
                  }
                  else {
                    iVar18 = If_CutDelaySop(p,pC);
                    fVar42 = (float)iVar18;
                  }
                  pC->Delay = fVar42;
                }
                else {
                  Cost = 0;
                  *(uint *)&pC->field_0x1c = uVar28 | 0x2000;
                  pwVar25 = If_CutTruthW(p,pC);
                  bVar4 = pC->field_0x1f;
                  piVar26 = If_CutArrTimeProfile(p,pC);
                  bVar5 = pC->field_0x1f;
                  iVar18 = If_ManCutAigDelay(p,pObj,pC);
                  iVar18 = Abc_ExactDelayCost(pwVar25,(uint)bVar4,piVar26,
                                              (char *)(&pC[1].Area + bVar5),&Cost,iVar18);
                  fVar42 = (float)iVar18;
                  pC->Delay = fVar42;
                  if (Cost == 1000000000) {
                    uVar28 = *(uint *)&pC->field_0x1c;
                    uVar30 = (ulong)(uVar28 >> 0x18);
                    for (uVar39 = 0; uVar39 < uVar30; uVar39 = uVar39 + 1) {
                      *(undefined1 *)((long)&pC[1].Area + uVar39 + uVar30 * 4) = 0x78;
                    }
                    *(uint *)&pC->field_0x1c = uVar28 | 0x4fff;
                  }
                }
              }
              else {
                iVar18 = If_CutSopBalanceEval(p,pC,(Vec_Int_t *)0x0);
LAB_0038d60b:
                fVar42 = (float)iVar18;
                pC->Delay = fVar42;
              }
              if (((fVar42 != -1.0) || (NAN(fVar42))) &&
                 ((bVar16 || (fVar42 <= pObj->Required + p->fEpsilon)))) {
                if (Mode == 2) {
                  fVar42 = If_CutAreaDerefed(p,pC);
                }
                else {
                  fVar42 = If_CutAreaFlow(p,pC);
                }
                pC->Area = fVar42;
                pIVar27 = p->pPars;
                if (pIVar27->fEdge != 0) {
                  if (Mode == 2) {
                    fVar42 = If_CutEdgeDerefed(p,pC);
                  }
                  else {
                    fVar42 = If_CutEdgeFlow(p,pC);
                  }
                  pC->Edge = fVar42;
                  pIVar27 = p->pPars;
                }
                if (pIVar27->fPower != 0) {
                  if (Mode == 2) {
                    fVar42 = If_CutPowerDerefed(p,pC,pObj);
                  }
                  else {
                    fVar42 = If_CutPowerFlow(p,pC,pObj);
                  }
                  pC->Power = fVar42;
                }
                If_CutSort(p,(If_Set_t *)pIVar23,pC);
              }
            }
          }
        }
      }
LAB_0038cebe:
    }
    lVar32 = lVar32 + 1;
  } while( true );
LAB_0038dc07:
  uVar19 = uVar19 + 1;
  goto LAB_0038db63;
}

Assistant:

void If_ObjPerformMappingAnd( If_Man_t * p, If_Obj_t * pObj, int Mode, int fPreprocess, int fFirst )
{
    If_Set_t * pCutSet;
    If_Cut_t * pCut0, * pCut1, * pCut;
    If_Cut_t * pCut0R, * pCut1R;
    int fFunc0R, fFunc1R;
    int i, k, v, iCutDsd, fChange;
    int fSave0 = p->pPars->fDelayOpt || p->pPars->fDelayOptLut || p->pPars->fDsdBalance || p->pPars->fUserRecLib || p->pPars->fUserSesLib || 
        p->pPars->fUseDsdTune || p->pPars->fUseCofVars || p->pPars->fUseAndVars || p->pPars->fUse34Spec || p->pPars->pLutStruct || p->pPars->pFuncCell2;
    int fUseAndCut = (p->pPars->nAndDelay > 0) || (p->pPars->nAndArea > 0);
    assert( !If_ObjIsAnd(pObj->pFanin0) || pObj->pFanin0->pCutSet->nCuts > 0 );
    assert( !If_ObjIsAnd(pObj->pFanin1) || pObj->pFanin1->pCutSet->nCuts > 0 );

    // prepare
    if ( Mode == 0 )
        pObj->EstRefs = (float)pObj->nRefs;
    else if ( Mode == 1 )
        pObj->EstRefs = (float)((2.0 * pObj->EstRefs + pObj->nRefs) / 3.0);
    // deref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaDeref( p, If_ObjCutBest(pObj) );

    // prepare the cutset
    pCutSet = If_ManSetupNodeCutSet( p, pObj );

    // get the current assigned best cut
    pCut = If_ObjCutBest(pObj);
    if ( !fFirst )
    {
        // recompute the parameters of the best cut
        if ( p->pPars->fDelayOpt )
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fDsdBalance )
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fUserRecLib )
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
        else if ( p->pPars->fUserSesLib )
        {
            int Cost = 0;
            pCut->fUser = 1;
            pCut->Delay = (float)Abc_ExactDelayCost( If_CutTruthW(p, pCut), If_CutLeaveNum(pCut), If_CutArrTimeProfile(p, pCut), If_CutPerm(pCut), &Cost, If_ManCutAigDelay(p, pObj, pCut) ); 
            if ( Cost == ABC_INFINITY )
            {
                for ( v = 0; v < If_CutLeaveNum(pCut); v++ )
                    If_CutPerm(pCut)[v] = IF_BIG_CHAR;
                pCut->Cost = IF_COST_MAX;
                pCut->fUseless = 1;
            }
        }
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        assert( pCut->Delay != -1 );
//        assert( pCut->Delay <= pObj->Required + p->fEpsilon );
        if ( pCut->Delay > pObj->Required + 2*p->fEpsilon )
            Abc_Print( 1, "If_ObjPerformMappingAnd(): Warning! Node with ID %d has delay (%f) exceeding the required times (%f).\n", 
                pObj->Id, pCut->Delay, pObj->Required + p->fEpsilon );
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
        // save the best cut from the previous iteration
        if ( !fPreprocess )
            If_CutCopy( p, pCutSet->ppCuts[pCutSet->nCuts++], pCut );
    }

    // generate cuts
    If_ObjForEachCut( pObj->pFanin0, pCut0, i )
    If_ObjForEachCut( pObj->pFanin1, pCut1, k )
    {
        // get the next free cut
        assert( pCutSet->nCuts <= pCutSet->nCutsMax );
        pCut = pCutSet->ppCuts[pCutSet->nCuts];
        // make sure K-feasible cut exists
        if ( If_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->pPars->nLutSize )
            continue;

        pCut0R = pCut0;
        pCut1R = pCut1;
        fFunc0R = pCut0->iCutFunc ^ pCut0->fCompl ^ pObj->fCompl0;
        fFunc1R = pCut1->iCutFunc ^ pCut1->fCompl ^ pObj->fCompl1;
        if ( !p->pPars->fUseTtPerm || pCut0->nLeaves > pCut1->nLeaves || (pCut0->nLeaves == pCut1->nLeaves && fFunc0R > fFunc1R) )
        {
        }
        else
        {
            ABC_SWAP( If_Cut_t *, pCut0R, pCut1R );
            ABC_SWAP( int, fFunc0R, fFunc1R );
        }        

        // merge the cuts
        if ( p->pPars->fUseTtPerm )
        {
            if ( !If_CutMerge( p, pCut0R, pCut1R, pCut ) )
                continue;
        }
        else
        {
            if ( !If_CutMergeOrdered( p, pCut0, pCut1, pCut ) )
                continue;
        }
        if ( pObj->fSpec && pCut->nLeaves == (unsigned)p->pPars->nLutSize )
            continue;
        p->nCutsMerged++;
        p->nCutsTotal++;
        // check if this cut is contained in any of the available cuts
        if ( !p->pPars->fSkipCutFilter && If_CutFilter( pCutSet, pCut, fSave0 ) )
            continue;
        // check if the cut is a special AND-gate cut
        pCut->fAndCut = fUseAndCut && pCut->nLeaves == 2 && pCut->pLeaves[0] == pObj->pFanin0->Id && pCut->pLeaves[1] == pObj->pFanin1->Id;
        //assert( pCut->nLeaves != 2 || pCut->pLeaves[0] < pCut->pLeaves[1] );
        //assert( pCut->nLeaves != 2 || pObj->pFanin0->Id < pObj->pFanin1->Id );
        // compute the truth table
        pCut->iCutFunc = -1;
        pCut->fCompl = 0;
        if ( p->pPars->fTruth )
        {
//            int nShared = pCut0->nLeaves + pCut1->nLeaves - pCut->nLeaves;
            abctime clk = 0;
            if ( p->pPars->fVerbose )
                clk = Abc_Clock();
            if ( p->pPars->fUseTtPerm )
                fChange = If_CutComputeTruthPerm( p, pCut, pCut0R, pCut1R, fFunc0R, fFunc1R );
            else
                fChange = If_CutComputeTruth( p, pCut, pCut0, pCut1, pObj->fCompl0, pObj->fCompl1 );
            if ( p->pPars->fVerbose )
                p->timeCache[4] += Abc_Clock() - clk;
            if ( !p->pPars->fSkipCutFilter && fChange && If_CutFilter( pCutSet, pCut, fSave0 ) )
                continue;
            if ( p->pPars->fLut6Filter && pCut->nLeaves == 6 && !If_CutCheckTruth6(p, pCut) )
                continue;
            if ( p->pPars->fUseDsd )
            {
                extern void If_ManCacheRecord( If_Man_t * p, int iDsd0, int iDsd1, int nShared, int iDsd );
                int truthId = Abc_Lit2Var(pCut->iCutFunc);
                if ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) || Vec_IntEntry(p->vTtDsds[pCut->nLeaves], truthId) == -1 )
                {
                    while ( truthId >= Vec_IntSize(p->vTtDsds[pCut->nLeaves]) )
                    {
                        Vec_IntPush( p->vTtDsds[pCut->nLeaves], -1 );
                        for ( v = 0; v < Abc_MaxInt(6, pCut->nLeaves); v++ )
                            Vec_StrPush( p->vTtPerms[pCut->nLeaves], IF_BIG_CHAR );
                    }
                    iCutDsd = If_DsdManCompute( p->pIfDsdMan, If_CutTruthWR(p, pCut), pCut->nLeaves, (unsigned char *)If_CutDsdPerm(p, pCut), p->pPars->pLutStruct );
                    Vec_IntWriteEntry( p->vTtDsds[pCut->nLeaves], truthId, iCutDsd );
                }
                assert( If_DsdManSuppSize(p->pIfDsdMan, If_CutDsdLit(p, pCut)) == (int)pCut->nLeaves );
                //If_ManCacheRecord( p, If_CutDsdLit(p, pCut0), If_CutDsdLit(p, pCut1), nShared, If_CutDsdLit(p, pCut) );
            }
            // run user functions
            pCut->fUseless = 0;
            if ( p->pPars->pFuncCell || p->pPars->pFuncCell2 )
            {
                assert( p->pPars->fUseTtPerm == 0 );
                assert( pCut->nLimit >= 4 && pCut->nLimit <= 16 );
                if ( p->pPars->fUseDsd )
                    pCut->fUseless = If_DsdManCheckDec( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                else if ( p->pPars->pFuncCell2 )
                    pCut->fUseless = !p->pPars->pFuncCell2( p, (word *)If_CutTruthW(p, pCut), pCut->nLeaves, NULL, NULL );
                else
                    pCut->fUseless = !p->pPars->pFuncCell( p, If_CutTruth(p, pCut), Abc_MaxInt(6, pCut->nLeaves), pCut->nLeaves, p->pPars->pLutStruct );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
                // skip 5-input cuts, which cannot be decomposed
                if ( (p->pPars->fEnableCheck75 || p->pPars->fEnableCheck75u) && pCut->nLeaves == 5 && pCut->nLimit == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) )
                        p->nCuts5a++;
                    else
                        continue;
                }
                else if ( p->pPars->fVerbose && pCut->nLeaves == 5 )
                {
                    extern int If_CluCheckDecInAny( word t, int nVars );
                    extern int If_CluCheckDecOut( word t, int nVars );
                    unsigned TruthU = *If_CutTruth(p, pCut);
                    word Truth = (((word)TruthU << 32) | (word)TruthU);
                    p->nCuts5++;
                    if ( If_CluCheckDecInAny( Truth, 5 ) || If_CluCheckDecOut( Truth, 5 ) )
                        p->nCuts5a++;
                }
            }
            else if ( p->pPars->fUseDsdTune )
            {
                pCut->fUseless = If_DsdManReadMark( p->pIfDsdMan, If_CutDsdLit(p, pCut) );
                p->nCutsUselessAll += pCut->fUseless;
                p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                p->nCutsCountAll++;
                p->nCutsCount[pCut->nLeaves]++;
            }
            else if ( p->pPars->fUse34Spec )
            {
                assert( pCut->nLeaves <= 4 );
                if ( pCut->nLeaves == 4 && !Abc_Tt4Check( (int)(0xFFFF & *If_CutTruth(p, pCut)) ) )
                    pCut->fUseless = 1;
            }
            else 
            {
                if ( p->pPars->fUseAndVars )
                {
                    int iDecMask = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    assert( p->pPars->nLutSize <= 13 );
                    if ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) || Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId) == -1 )
                    {
                        while ( truthId >= Vec_IntSize(p->vTtDecs[pCut->nLeaves]) )
                            Vec_IntPush( p->vTtDecs[pCut->nLeaves], -1 );
                        if ( (int)pCut->nLeaves > p->pPars->nLutSize / 2 && (int)pCut->nLeaves <= 2 * (p->pPars->nLutSize / 2) )
                            iDecMask = Abc_TtProcessBiDec( If_CutTruthWR(p, pCut), (int)pCut->nLeaves, p->pPars->nLutSize / 2 );
                        else
                            iDecMask = 0;
                        Vec_IntWriteEntry( p->vTtDecs[pCut->nLeaves], truthId, iDecMask );
                    }
                    iDecMask = Vec_IntEntry(p->vTtDecs[pCut->nLeaves], truthId);
                    assert( iDecMask >= 0 );
                    pCut->fUseless = (int)(iDecMask == 0 && (int)pCut->nLeaves > p->pPars->nLutSize / 2);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
                if ( p->pPars->fUseCofVars && (!p->pPars->fUseAndVars || pCut->fUseless) )
                {
                    int iCofVar = -1, truthId = Abc_Lit2Var(pCut->iCutFunc);
                    if ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) || Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId) == (char)-1 )
                    {
                        while ( truthId >= Vec_StrSize(p->vTtVars[pCut->nLeaves]) )
                            Vec_StrPush( p->vTtVars[pCut->nLeaves], (char)-1 );
                        iCofVar = Abc_TtCheckCondDep( If_CutTruthWR(p, pCut), pCut->nLeaves, p->pPars->nLutSize / 2 );
                        Vec_StrWriteEntry( p->vTtVars[pCut->nLeaves], truthId, (char)iCofVar );
                    }
                    iCofVar = Vec_StrEntry(p->vTtVars[pCut->nLeaves], truthId);
                    assert( iCofVar >= 0 && iCofVar <= (int)pCut->nLeaves );
                    pCut->fUseless = (int)(iCofVar == (int)pCut->nLeaves && pCut->nLeaves > 0);
                    p->nCutsUselessAll += pCut->fUseless;
                    p->nCutsUseless[pCut->nLeaves] += pCut->fUseless;
                    p->nCutsCountAll++;
                    p->nCutsCount[pCut->nLeaves]++;
                }
            }
        }
        
        // compute the application-specific cost and depth
        pCut->fUser = (p->pPars->pFuncCost != NULL);
        pCut->Cost = p->pPars->pFuncCost? p->pPars->pFuncCost(p, pCut) : 0;
        if ( pCut->Cost == IF_COST_MAX )
            continue;
        // check if the cut satisfies the required times
        if ( p->pPars->fDelayOpt )
            pCut->Delay = If_CutSopBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fDsdBalance )
            pCut->Delay = If_CutDsdBalanceEval( p, pCut, NULL );
        else if ( p->pPars->fUserRecLib )
            pCut->Delay = If_CutDelayRecCost3( p, pCut, pObj ); 
        else if ( p->pPars->fUserSesLib )
        {
            int Cost = 0;
            pCut->fUser = 1;
            pCut->Delay = (float)Abc_ExactDelayCost( If_CutTruthW(p, pCut), If_CutLeaveNum(pCut), If_CutArrTimeProfile(p, pCut), If_CutPerm(pCut), &Cost, If_ManCutAigDelay(p, pObj, pCut) ); 
            if ( Cost == ABC_INFINITY )
            {
                for ( v = 0; v < If_CutLeaveNum(pCut); v++ )
                    If_CutPerm(pCut)[v] = IF_BIG_CHAR;
                pCut->Cost = IF_COST_MAX;
                pCut->fUseless = 1;
            }
        }
        else if ( p->pPars->fDelayOptLut )
            pCut->Delay = If_CutLutBalanceEval( p, pCut );
        else if( p->pPars->nGateSize > 0 )
            pCut->Delay = If_CutDelaySop( p, pCut );
        else 
            pCut->Delay = If_CutDelay( p, pObj, pCut );
        if ( pCut->Delay == -1 )
            continue;
        if ( Mode && pCut->Delay > pObj->Required + p->fEpsilon )
            continue;
        // compute area of the cut (this area may depend on the application specific cost)
        pCut->Area = (Mode == 2)? If_CutAreaDerefed( p, pCut ) : If_CutAreaFlow( p, pCut );
        if ( p->pPars->fEdge )
            pCut->Edge = (Mode == 2)? If_CutEdgeDerefed( p, pCut ) : If_CutEdgeFlow( p, pCut );
        if ( p->pPars->fPower )
            pCut->Power = (Mode == 2)? If_CutPowerDerefed( p, pCut, pObj ) : If_CutPowerFlow( p, pCut, pObj );
//        pCut->AveRefs = (Mode == 0)? (float)0.0 : If_CutAverageRefs( p, pCut );
        // insert the cut into storage
        If_CutSort( p, pCutSet, pCut );
//        If_CutTraverse( p, pObj, pCut );
    } 
    assert( pCutSet->nCuts > 0 );
//    If_CutVerifyCuts( pCutSet, !p->pPars->fUseTtPerm );

    // update the best cut
    if ( !fPreprocess || pCutSet->ppCuts[0]->Delay <= pObj->Required + p->fEpsilon )
    {
        If_CutCopy( p, If_ObjCutBest(pObj), pCutSet->ppCuts[0] );
        if ( p->pPars->fUserRecLib || p->pPars->fUserSesLib )
            assert(If_ObjCutBest(pObj)->Cost < IF_COST_MAX && If_ObjCutBest(pObj)->Delay < ABC_INFINITY);
    }
    // add the trivial cut to the set
    if ( !pObj->fSkipCut && If_ObjCutBest(pObj)->nLeaves > 1 )
    {
        If_ManSetupCutTriv( p, pCutSet->ppCuts[pCutSet->nCuts++], pObj->Id );
        assert( pCutSet->nCuts <= pCutSet->nCutsMax+1 );
    }
//    if ( If_ObjCutBest(pObj)->nLeaves == 0 )
//        p->nBestCutSmall[0]++;
//    else if ( If_ObjCutBest(pObj)->nLeaves == 1 )
//        p->nBestCutSmall[1]++;

    // ref the selected cut
    if ( Mode && pObj->nRefs > 0 )
        If_CutAreaRef( p, If_ObjCutBest(pObj) );
    if ( If_ObjCutBest(pObj)->fUseless )
        Abc_Print( 1, "The best cut is useless.\n" );
    // call the user specified function for each cut
    if ( p->pPars->pFuncUser )
        If_ObjForEachCut( pObj, pCut, i )
            p->pPars->pFuncUser( p, pObj, pCut );
    // free the cuts
    If_ManDerefNodeCutSet( p, pObj );
}